

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void * drwav__malloc_from_callbacks(size_t sz,drwav_allocation_callbacks *pAllocationCallbacks)

{
  undefined8 *in_RSI;
  undefined8 in_RDI;
  void *local_8;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_8 = (void *)0x0;
  }
  else if (in_RSI[1] == 0) {
    if (in_RSI[2] == 0) {
      local_8 = (void *)0x0;
    }
    else {
      local_8 = (void *)(*(code *)in_RSI[2])(0,in_RDI,*in_RSI);
    }
  }
  else {
    local_8 = (void *)(*(code *)in_RSI[1])(in_RDI,*in_RSI);
  }
  return local_8;
}

Assistant:

static void* drwav__malloc_from_callbacks(size_t sz, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks == NULL) {
        return NULL;
    }

    if (pAllocationCallbacks->onMalloc != NULL) {
        return pAllocationCallbacks->onMalloc(sz, pAllocationCallbacks->pUserData);
    }

    /* Try using realloc(). */
    if (pAllocationCallbacks->onRealloc != NULL) {
        return pAllocationCallbacks->onRealloc(NULL, sz, pAllocationCallbacks->pUserData);
    }

    return NULL;
}